

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O3

State<wasm::HeapType> * __thiscall
wasm::anon_unknown_0::TypeMerging::makeDFAState
          (State<wasm::HeapType> *__return_storage_ptr__,TypeMerging *this,HeapType type)

{
  HeapType HVar1;
  HeapType local_70;
  HeapType type_local;
  pointer local_60;
  pointer local_58;
  HeapType local_50;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_48;
  
  local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.id = type.id;
  HeapType::getHeapTypeChildren
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&type_local,&local_70);
  if ((pointer)type_local.id != local_60) {
    HVar1 = type_local;
    do {
      if (0xd < ((pointer)HVar1.id)->id) {
        local_50 = getMerged(this,((pointer)HVar1.id)->id);
        if (local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>
                    (&local_48,
                     (iterator)
                     local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          (local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_finish)->id = local_50.id;
          local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      HVar1.id = HVar1.id + 8;
    } while ((pointer)HVar1.id != local_60);
  }
  if ((void *)type_local.id != (void *)0x0) {
    operator_delete((void *)type_local.id,(long)local_58 - type_local.id);
  }
  (__return_storage_ptr__->val).id = local_70.id;
  (__return_storage_ptr__->succs).
  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->succs).
  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->succs).
  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  return (State<wasm::HeapType> *)
         local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
}

Assistant:

DFA::State<HeapType> TypeMerging::makeDFAState(HeapType type) {
  std::vector<HeapType> succs;
  for (auto child : type.getHeapTypeChildren()) {
    // Both private and public heap type children participate in the DFA and are
    // eligible to be successors.
    if (!child.isBasic()) {
      succs.push_back(getMerged(child));
    }
  }
  return {type, std::move(succs)};
}